

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

bool_t prf_state_material_lookup(prf_state_t *state,uint index,prf_material_t *material)

{
  uint uVar1;
  uint *puVar2;
  uint *in_RDX;
  uint in_ESI;
  long in_RDI;
  prf_material_t *mat;
  prf_node_t *node;
  prf_material_palette_data *original;
  uint i;
  uint count;
  uint local_28;
  bool_t local_4;
  
  if (*(long *)(in_RDI + 0x28) == 0) {
    uVar1 = prf_array_count((void *)0x1073b5);
    for (local_28 = 0; local_28 < uVar1; local_28 = local_28 + 1) {
      puVar2 = *(uint **)(*(long *)(*(long *)(in_RDI + 0x30) + (ulong)local_28 * 8) + 8);
      if (*puVar2 == in_ESI) {
        memcpy(in_RDX,puVar2,0x4c);
        return 1;
      }
    }
    local_4 = 0;
  }
  else if (in_ESI < SUB164(ZEXT216(*(ushort *)(*(long *)(in_RDI + 0x28) + 2)) / ZEXT816(0xb8),0)) {
    puVar2 = (uint *)(*(long *)(*(long *)(in_RDI + 0x28) + 8) + (ulong)in_ESI * 0xb8);
    *in_RDX = in_ESI;
    *(undefined8 *)(in_RDX + 1) = *(undefined8 *)(puVar2 + 0xf);
    in_RDX[3] = puVar2[0x11];
    in_RDX[4] = puVar2[0xe];
    in_RDX[5] = *puVar2;
    in_RDX[6] = puVar2[1];
    in_RDX[7] = puVar2[2];
    in_RDX[8] = puVar2[3];
    in_RDX[9] = puVar2[4];
    in_RDX[10] = puVar2[5];
    in_RDX[0xb] = puVar2[6];
    in_RDX[0xc] = puVar2[7];
    in_RDX[0xd] = puVar2[8];
    in_RDX[0xe] = puVar2[9];
    in_RDX[0xf] = puVar2[10];
    in_RDX[0x10] = puVar2[0xb];
    in_RDX[0x11] = puVar2[0xc];
    in_RDX[0x12] = puVar2[0xd];
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

bool_t
prf_state_material_lookup( 
    prf_state_t * state,
    unsigned int index,
    prf_material_t * material )
{
    unsigned int count, i;
    assert( state != NULL && material != NULL );
    if ( state->material_palette != NULL ) { /* old-style material palette */
        struct prf_material_palette_data * original;
        original = (struct prf_material_palette_data *)
            state->material_palette->data;
        count = state->material_palette->length /
                sizeof( struct prf_material_palette_data );
        if ( index >= count )
            return FALSE;
        original += index;
        material->material_index = index;
        memcpy( material->name, original->name, 12 );
        material->flags = original->flags;
        material->ambient_red   = original->ambient_red;
        material->ambient_green = original->ambient_green;
        material->ambient_blue  = original->ambient_blue;
        material->diffuse_red   = original->diffuse_red;
        material->diffuse_green = original->diffuse_green;
        material->diffuse_blue  = original->diffuse_blue;
        material->specular_red   = original->specular_red;
        material->specular_green = original->specular_green;
        material->specular_blue  = original->specular_blue;
        material->emissive_red   = original->emissive_red;
        material->emissive_green = original->emissive_green;
        material->emissive_blue  = original->emissive_blue;
        material->shininess = original->shininess;
        material->alpha = original->alpha;
        return TRUE;
    } else { /* new material record node set */
        count = prf_array_count( state->materials );
        for ( i = 0; i < count; i++ ) {
            prf_node_t * node;
            prf_material_t * mat;
            node = state->materials[i];
            mat = (prf_material_t *) node->data;
            if ( mat->material_index == index ) {
             /* fprintf(stderr,"mat shininess: %f\n", mat->shininess); */
	        memcpy( material, mat, sizeof( prf_material_t ) );
	        return TRUE;
            }
        }
    }

    return FALSE;
}